

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

var __thiscall cs::runtime_type::get_string_literal(runtime_type *this,string *data,string *literal)

{
  initializer_list<cs_impl::any> __l;
  size_t sVar1;
  string *str;
  proxy *in_RDI;
  vector arg;
  vector *in_stack_ffffffffffffff00;
  runtime_error *this_00;
  callable *in_stack_ffffffffffffff08;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffff10;
  key_arg<std::__cxx11::basic_string<char>_> *in_stack_ffffffffffffff18;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  *in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff28;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff40;
  undefined8 ***pppuVar2;
  undefined1 ***local_b8;
  undefined1 local_89 [49];
  undefined8 **local_58;
  undefined1 **local_50;
  undefined8 **local_48;
  undefined8 local_40;
  
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
          ::count<std::__cxx11::string>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (sVar1 != 0) {
    local_58 = &local_50;
    cs_impl::any::any<std::__cxx11::string>
              ((any *)in_stack_ffffffffffffff10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff08);
    local_48 = &local_50;
    local_40 = 1;
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x145615);
    __l._M_len = in_stack_ffffffffffffff40;
    __l._M_array = in_stack_ffffffffffffff38;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (in_stack_ffffffffffffff30,__l,in_stack_ffffffffffffff28);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x145646);
    pppuVar2 = (undefined8 ***)&local_50;
    local_b8 = (undefined1 ***)&local_48;
    do {
      local_b8 = local_b8 + -1;
      cs_impl::any::~any((any *)0x14566f);
    } while ((undefined8 ***)local_b8 != pppuVar2);
    phmap::priv::
    raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
    ::at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>>
              ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    callable::call(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(in_stack_ffffffffffffff10);
    return (var)in_RDI;
  }
  str = (string *)__cxa_allocate_exception(0x28);
  this_00 = (runtime_error *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_89 + 1),"Undefined String Literal.",(allocator *)this_00);
  runtime_error::runtime_error(this_00,str);
  __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var get_string_literal(const std::string &data, const std::string &literal)
		{
			if (literals.count(literal) > 0) {
				vector arg{data};
				return literals.at(literal).call(arg);
			}
			else
				throw runtime_error("Undefined String Literal.");
		}